

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed-dtoa.cc
# Opt level: O2

void __thiscall
FIX::double_conversion::FillFractionals
          (double_conversion *this,uint64_t fractionals,int exponent,int fractional_count,
          Vector<char> buffer,int *length,int *decimal_point)

{
  int iVar1;
  char *pcVar2;
  uint64_t uVar3;
  byte bVar4;
  undefined4 in_register_0000000c;
  int *decimal_point_00;
  int *piVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  Vector<char> buffer_00;
  Vector<char> buffer_local;
  UInt128 fractionals128;
  
  buffer_local.start_ = (char *)CONCAT44(in_register_0000000c,fractional_count);
  piVar5 = buffer._8_8_;
  decimal_point_00 = (int *)buffer.start_;
  uVar7 = (uint)fractionals;
  buffer_local.length_ = (int)buffer.start_;
  if ((int)uVar7 < -0x40) {
    fractionals128.low_bits_ = 0;
    fractionals128.high_bits_ = (uint64_t)this;
    UInt128::Shift(&fractionals128,-0x40 - uVar7);
    iVar8 = 0;
    if (0 < exponent) {
      iVar8 = exponent;
    }
    iVar9 = 0x80;
    while ((iVar8 + iVar9 != 0x80 &&
           (fractionals128.high_bits_ != 0 || fractionals128.low_bits_ != 0))) {
      UInt128::Multiply(&fractionals128,5);
      iVar9 = iVar9 + -1;
      iVar1 = UInt128::DivModPowerOf2(&fractionals128,iVar9);
      if (9 < iVar1) {
        __assert_fail("digit <= 9",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fixed-dtoa.cc"
                      ,0x116,
                      "void FIX::double_conversion::FillFractionals(uint64_t, int, int, Vector<char>, int *, int *)"
                     );
      }
      pcVar2 = Vector<char>::operator[](&buffer_local,*piVar5);
      *pcVar2 = (char)iVar1 + '0';
      *piVar5 = *piVar5 + 1;
    }
    uVar3 = fractionals128.low_bits_;
    if (0x40 < iVar9) {
      uVar3 = fractionals128.high_bits_;
    }
    uVar6 = uVar3 >> ((ulong)(iVar9 + 0xbf) & 0x3f);
  }
  else {
    if ((ulong)this >> 0x38 != 0) {
      __assert_fail("fractionals >> 56 == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fixed-dtoa.cc"
                    ,0xef,
                    "void FIX::double_conversion::FillFractionals(uint64_t, int, int, Vector<char>, int *, int *)"
                   );
    }
    uVar7 = ~uVar7;
    iVar8 = 0;
    for (; (iVar8 < exponent && (this != (double_conversion *)0x0));
        this = (double_conversion *)((long)this * 5 - ((long)iVar9 << (bVar4 & 0x3f)))) {
      bVar4 = (byte)uVar7;
      uVar6 = (ulong)((long)this * 5) >> (bVar4 & 0x3f);
      iVar9 = (int)uVar6;
      if (9 < iVar9) {
        __assert_fail("digit <= 9",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fixed-dtoa.cc"
                      ,0x100,
                      "void FIX::double_conversion::FillFractionals(uint64_t, int, int, Vector<char>, int *, int *)"
                     );
      }
      pcVar2 = Vector<char>::operator[](&buffer_local,*piVar5);
      *pcVar2 = (char)uVar6 + '0';
      *piVar5 = *piVar5 + 1;
      iVar8 = iVar8 + 1;
      uVar7 = uVar7 - 1;
    }
    uVar6 = (ulong)this >> ((ulong)uVar7 & 0x3f);
  }
  if ((uVar6 & 1) != 0) {
    buffer_00.start_ = (char *)(ulong)(uint)buffer_local.length_;
    buffer_00._8_8_ = piVar5;
    RoundUp((double_conversion *)buffer_local.start_,buffer_00,length,decimal_point_00);
  }
  return;
}

Assistant:

static void FillFractionals(uint64_t fractionals, int exponent,
                            int fractional_count, Vector<char> buffer,
                            int* length, int* decimal_point) {
  ASSERT(-128 <= exponent && exponent <= 0);
  // 'fractionals' is a fixed-point number, with binary point at bit
  // (-exponent). Inside the function the non-converted remainder of fractionals
  // is a fixed-point number, with binary point at bit 'point'.
  if (-exponent <= 64) {
    // One 64 bit number is sufficient.
    ASSERT(fractionals >> 56 == 0);
    int point = -exponent;
    for (int i = 0; i < fractional_count; ++i) {
      if (fractionals == 0) break;
      // Instead of multiplying by 10 we multiply by 5 and adjust the point
      // location. This way the fractionals variable will not overflow.
      // Invariant at the beginning of the loop: fractionals < 2^point.
      // Initially we have: point <= 64 and fractionals < 2^56
      // After each iteration the point is decremented by one.
      // Note that 5^3 = 125 < 128 = 2^7.
      // Therefore three iterations of this loop will not overflow fractionals
      // (even without the subtraction at the end of the loop body). At this
      // time point will satisfy point <= 61 and therefore fractionals < 2^point
      // and any further multiplication of fractionals by 5 will not overflow.
      fractionals *= 5;
      point--;
      int digit = static_cast<int>(fractionals >> point);
      ASSERT(digit <= 9);
      buffer[*length] = static_cast<char>('0' + digit);
      (*length)++;
      fractionals -= static_cast<uint64_t>(digit) << point;
    }
    // If the first bit after the point is set we have to round up.
    if (((fractionals >> (point - 1)) & 1) == 1) {
      RoundUp(buffer, length, decimal_point);
    }
  } else {  // We need 128 bits.
    ASSERT(64 < -exponent && -exponent <= 128);
    UInt128 fractionals128 = UInt128(fractionals, 0);
    fractionals128.Shift(-exponent - 64);
    int point = 128;
    for (int i = 0; i < fractional_count; ++i) {
      if (fractionals128.IsZero()) break;
      // As before: instead of multiplying by 10 we multiply by 5 and adjust the
      // point location.
      // This multiplication will not overflow for the same reasons as before.
      fractionals128.Multiply(5);
      point--;
      int digit = fractionals128.DivModPowerOf2(point);
      ASSERT(digit <= 9);
      buffer[*length] = static_cast<char>('0' + digit);
      (*length)++;
    }
    if (fractionals128.BitAt(point - 1) == 1) {
      RoundUp(buffer, length, decimal_point);
    }
  }
}